

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-handle-fileno.c
# Opt level: O0

int run_test_handle_fileno(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop_00;
  uv_loop_t *loop;
  uv_idle_t idle;
  uv_tty_t tty;
  uv_pipe_t pipe;
  uv_udp_t udp;
  uv_tcp_t tcp;
  undefined1 local_20 [4];
  uv_os_fd_t fd;
  sockaddr_in addr;
  int tty_fd;
  int r;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_20);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x3b,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  addr.sin_zero._4_4_ = uv_idle_init(uVar2,&loop);
  if (addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x3e,"r == 0");
    abort();
  }
  addr.sin_zero._4_4_ = uv_fileno(&loop,(undefined1 *)((long)&tcp.queued_fds + 4));
  if (addr.sin_zero._4_4_ != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x40,"r == UV_EINVAL");
    abort();
  }
  uv_close(&loop,0);
  addr.sin_zero._4_4_ = uv_tcp_init(uVar2,udp.write_completed_queue + 1);
  if (addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x44,"r == 0");
    abort();
  }
  addr.sin_zero._4_4_ =
       uv_fileno(udp.write_completed_queue + 1,(undefined1 *)((long)&tcp.queued_fds + 4));
  if (addr.sin_zero._4_4_ != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x46,"r == UV_EBADF");
    abort();
  }
  addr.sin_zero._4_4_ = uv_tcp_bind(udp.write_completed_queue + 1,local_20,0);
  if (addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x48,"r == 0");
    abort();
  }
  addr.sin_zero._4_4_ =
       uv_fileno(udp.write_completed_queue + 1,(undefined1 *)((long)&tcp.queued_fds + 4));
  if (addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x4a,"r == 0");
    abort();
  }
  uv_close(udp.write_completed_queue + 1,0);
  addr.sin_zero._4_4_ =
       uv_fileno(udp.write_completed_queue + 1,(undefined1 *)((long)&tcp.queued_fds + 4));
  if (addr.sin_zero._4_4_ != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x4d,"r == UV_EBADF");
    abort();
  }
  addr.sin_zero._4_4_ = uv_udp_init(uVar2,&pipe.pipe_fname);
  if (addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x50,"r == 0");
    abort();
  }
  addr.sin_zero._4_4_ = uv_fileno(&pipe.pipe_fname,(undefined1 *)((long)&tcp.queued_fds + 4));
  if (addr.sin_zero._4_4_ != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x52,"r == UV_EBADF");
    abort();
  }
  addr.sin_zero._4_4_ = uv_udp_bind(&pipe.pipe_fname,local_20,0);
  if (addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x54,"r == 0");
    abort();
  }
  addr.sin_zero._4_4_ = uv_fileno(&pipe.pipe_fname,(undefined1 *)((long)&tcp.queued_fds + 4));
  if (addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x56,"r == 0");
    abort();
  }
  uv_close(&pipe.pipe_fname,0);
  addr.sin_zero._4_4_ = uv_fileno(&pipe.pipe_fname,(undefined1 *)((long)&tcp.queued_fds + 4));
  if (addr.sin_zero._4_4_ != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x59,"r == UV_EBADF");
    abort();
  }
  addr.sin_zero._4_4_ = uv_pipe_init(uVar2,&tty.orig_termios.c_ospeed,0);
  if (addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x5c,"r == 0");
    abort();
  }
  addr.sin_zero._4_4_ =
       uv_fileno(&tty.orig_termios.c_ospeed,(undefined1 *)((long)&tcp.queued_fds + 4));
  if (addr.sin_zero._4_4_ != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x5e,"r == UV_EBADF");
    abort();
  }
  addr.sin_zero._4_4_ = uv_pipe_bind(&tty.orig_termios.c_ospeed,"/tmp/uv-test-sock");
  if (addr.sin_zero._4_4_ == 0) {
    addr.sin_zero._4_4_ =
         uv_fileno(&tty.orig_termios.c_ospeed,(undefined1 *)((long)&tcp.queued_fds + 4));
    if (addr.sin_zero._4_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
              ,0x62,"r == 0");
      abort();
    }
    uv_close(&tty.orig_termios.c_ospeed,0);
    addr.sin_zero._4_4_ =
         uv_fileno(&tty.orig_termios.c_ospeed,(undefined1 *)((long)&tcp.queued_fds + 4));
    if (addr.sin_zero._4_4_ != -9) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
              ,0x65,"r == UV_EBADF");
      abort();
    }
    addr.sin_zero._0_4_ = get_tty_fd();
    if ((int)addr.sin_zero._0_4_ < 0) {
      fprintf(_stderr,"Cannot open a TTY fd");
      fflush(_stderr);
    }
    else {
      addr.sin_zero._4_4_ = uv_tty_init(uVar2,idle.queue + 1,addr.sin_zero._0_4_,0);
      if (addr.sin_zero._4_4_ != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
                ,0x6d,"r == 0");
        abort();
      }
      iVar1 = uv_is_readable(idle.queue + 1);
      if (iVar1 == 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
                ,0x6e,"uv_is_readable((uv_stream_t*) &tty)");
        abort();
      }
      iVar1 = uv_is_writable(idle.queue + 1);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
                ,0x6f,"!uv_is_writable((uv_stream_t*) &tty)");
        abort();
      }
      addr.sin_zero._4_4_ = uv_fileno(idle.queue + 1,(undefined1 *)((long)&tcp.queued_fds + 4));
      if (addr.sin_zero._4_4_ != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
                ,0x71,"r == 0");
        abort();
      }
      uv_close(idle.queue + 1,0);
      addr.sin_zero._4_4_ = uv_fileno(idle.queue + 1,(undefined1 *)((long)&tcp.queued_fds + 4));
      if (addr.sin_zero._4_4_ != -9) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
                ,0x74,"r == UV_EBADF");
        abort();
      }
      iVar1 = uv_is_readable(idle.queue + 1);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
                ,0x75,"!uv_is_readable((uv_stream_t*) &tty)");
        abort();
      }
      iVar1 = uv_is_writable(idle.queue + 1);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
                ,0x76,"!uv_is_writable((uv_stream_t*) &tty)");
        abort();
      }
    }
    uv_run(uVar2,0);
    loop_00 = (uv_loop_t *)uv_default_loop();
    close_loop(loop_00);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
            ,0x7b,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
          ,0x60,"r == 0");
  abort();
}

Assistant:

TEST_IMPL(handle_fileno) {
  int r;
  int tty_fd;
  struct sockaddr_in addr;
  uv_os_fd_t fd;
  uv_tcp_t tcp;
  uv_udp_t udp;
  uv_pipe_t pipe;
  uv_tty_t tty;
  uv_idle_t idle;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_idle_init(loop, &idle);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &idle, &fd);
  ASSERT(r == UV_EINVAL);
  uv_close((uv_handle_t*) &idle, NULL);

  r = uv_tcp_init(loop, &tcp);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT(r == UV_EBADF);
  r = uv_tcp_bind(&tcp, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT(r == 0);
  uv_close((uv_handle_t*) &tcp, NULL);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT(r == UV_EBADF);

  r = uv_udp_init(loop, &udp);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT(r == UV_EBADF);
  r = uv_udp_bind(&udp, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT(r == 0);
  uv_close((uv_handle_t*) &udp, NULL);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT(r == UV_EBADF);

  r = uv_pipe_init(loop, &pipe, 0);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT(r == UV_EBADF);
  r = uv_pipe_bind(&pipe, TEST_PIPENAME);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT(r == 0);
  uv_close((uv_handle_t*) &pipe, NULL);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT(r == UV_EBADF);

  tty_fd = get_tty_fd();
  if (tty_fd < 0) {
    fprintf(stderr, "Cannot open a TTY fd");
    fflush(stderr);
  } else {
    r = uv_tty_init(loop, &tty, tty_fd, 0);
    ASSERT(r == 0);
    ASSERT(uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT(r == 0);
    uv_close((uv_handle_t*) &tty, NULL);
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT(r == UV_EBADF);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
  }

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}